

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  ExtensionRange *pEVar1;
  int index;
  
  index = 0;
  do {
    if (this->extension_range_count_ <= index) {
      return (ExtensionRange *)0x0;
    }
    pEVar1 = extension_range(this,index);
    if (pEVar1->start_ <= number) {
      pEVar1 = extension_range(this,index);
      if (number < pEVar1->end_) {
        pEVar1 = extension_range(this,index);
        return pEVar1;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start_number() &&
        number < extension_range(i)->end_number()) {
      return extension_range(i);
    }
  }
  return nullptr;
}